

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Stress::anon_unknown_0::FramebufferRenderCase::iterate(FramebufferRenderCase *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3]
          )();
  if (this->m_fboID != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x78))(0x8d40);
  }
  (*(this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[7])(this);
  return STOP;
}

Assistant:

FramebufferRenderCase::IterateResult FramebufferRenderCase::iterate (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// bind fbo (or don't if we are using default)
	if (m_fboID)
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fboID);

	// do something with special floats
	testFBO();

	return STOP;
}